

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void snap_handle_reader_ops(SnapHandlePool *shp)

{
  int iVar1;
  ts_nsec tVar2;
  ts_nsec tVar3;
  fdb_iterator *in_RDI;
  int i;
  char keybuf [256];
  ts_nsec end;
  ts_nsec begin;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_kvs_handle *snapClone;
  fdb_status status;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined4 in_stack_fffffffffffffe8c;
  uint64_t in_stack_fffffffffffffe90;
  fdb_iterator *in_stack_fffffffffffffe98;
  fdb_iterator *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  fdb_iterator *file;
  char *in_stack_fffffffffffffeb0;
  fdb_iterator *expression;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  char local_138 [56];
  fdb_doc **in_stack_ffffffffffffff00;
  fdb_iterator *in_stack_ffffffffffffff08;
  fdb_iterator *local_20;
  fdb_kvs_handle *local_18;
  fdb_status local_c;
  fdb_iterator *local_8;
  
  local_8 = in_RDI;
  local_18 = SnapHandlePool::getCloneOfASnapHandle
                       ((SnapHandlePool *)
                        CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  if (local_18 != (fdb_kvs_handle *)0x0) {
    local_20 = (fdb_iterator *)0x0;
    tVar2 = get_monotonic_ts();
    uVar4 = 0;
    uVar5 = 0;
    local_c = fdb_iterator_init(local_18,&local_20,(void *)0x0,0,(void *)0x0,0,0);
    tVar3 = get_monotonic_ts();
    if (local_c != FDB_RESULT_SUCCESS) {
      fdb_assert_die(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (uint64_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    }
    file = local_8;
    ts_diff(tVar2,tVar3);
    FileHandlePool::collectStat
              ((FileHandlePool *)in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    iVar1 = rand();
    sprintf(local_138,"key%d",(ulong)(uint)(iVar1 % 100));
    tVar2 = get_monotonic_ts();
    expression = local_20;
    strlen(local_138);
    local_c = fdb_iterator_seek(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                in_stack_fffffffffffffe90,
                                (fdb_iterator_seek_opt_t)((uint)in_stack_fffffffffffffe8c >> 0x18));
    tVar3 = get_monotonic_ts();
    if (local_c == FDB_RESULT_SUCCESS) {
      in_stack_fffffffffffffea0 = local_8;
      ts_diff(tVar2,tVar3);
      FileHandlePool::collectStat
                ((FileHandlePool *)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    }
    else if (local_c != FDB_RESULT_ITERATOR_FAIL) {
      fdb_assert_die((char *)expression,(char *)file,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20)
                     ,(uint64_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    }
    tVar2 = get_monotonic_ts();
    local_c = fdb_iterator_get(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    tVar3 = get_monotonic_ts();
    if (local_c == FDB_RESULT_SUCCESS) {
      fdb_doc_free((fdb_doc *)0x10518e);
      in_stack_fffffffffffffe98 = local_8;
      ts_diff(tVar2,tVar3);
      FileHandlePool::collectStat
                ((FileHandlePool *)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    }
    else if (local_c != FDB_RESULT_ITERATOR_FAIL) {
      fdb_assert_die((char *)expression,(char *)file,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20)
                     ,(uint64_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    }
    tVar2 = get_monotonic_ts();
    local_c = fdb_iterator_close(in_stack_fffffffffffffe98);
    tVar3 = get_monotonic_ts();
    if (local_c != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)expression,(char *)file,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20)
                     ,(uint64_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    }
    ts_diff(tVar2,tVar3);
    FileHandlePool::collectStat
              ((FileHandlePool *)in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(uint64_t)local_8);
    iVar1 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
    local_c = fdb_kvs_close((fdb_kvs_handle *)
                            CONCAT44(in_stack_fffffffffffffe8c,CONCAT22(uVar5,uVar4)));
    if (local_c != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)expression,(char *)file,iVar1,(uint64_t)in_stack_fffffffffffffe98,
                     (uint64_t)local_8);
    }
  }
  return;
}

Assistant:

void snap_handle_reader_ops(SnapHandlePool *shp) {
    fdb_status status;
    fdb_kvs_handle *snapClone = shp->getCloneOfASnapHandle();
    if (!snapClone) {
        // No snapshot handle available yet
        return;
    }

    fdb_iterator *iterator = nullptr;
    fdb_doc *rdoc = nullptr;
    ts_nsec begin, end;

    // Initialize iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_init(snapClone, &iterator,
                               nullptr, 0, nullptr, 0,
                               FDB_ITR_NONE);
    end = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    shp->collectStat(ITR_INIT, ts_diff(begin, end));

    // Seek random key with iterator
    char keybuf[256];
    int i = rand() % 100;
    sprintf(keybuf, "key%d", i);
    begin = get_monotonic_ts();
    status = fdb_iterator_seek(iterator,
                               (void*)keybuf, strlen(keybuf),
                               FDB_ITR_SEEK_HIGHER);
    end = get_monotonic_ts();
    if (status == FDB_RESULT_SUCCESS) {
        shp->collectStat(ITR_SEEK, ts_diff(begin, end));
    } else {
        // Block not found, no keys available
        fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                   status, FDB_RESULT_ITERATOR_FAIL);
    }

    // Get using iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_get(iterator, &rdoc);
    end = get_monotonic_ts();
    if (status == FDB_RESULT_SUCCESS) {
        fdb_doc_free(rdoc);
        shp->collectStat(ITR_GET, ts_diff(begin, end));
    } else {
        fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                   status, FDB_RESULT_ITERATOR_FAIL);
    }

    // Close iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_close(iterator);
    end = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    shp->collectStat(ITR_CLOSE, ts_diff(begin, end));

    // Close snapshot clone
    status = fdb_kvs_close(snapClone);
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
}